

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O2

char16 * JsrtDebugUtils::GetClassName(TypeId typeId)

{
  code *pcVar1;
  bool bVar2;
  char16 *pcVar3;
  undefined4 *puVar4;
  uint uVar5;
  
  uVar5 = typeId - TypeIds_Proxy;
  if ((uVar5 < 0x3b) && ((0x47d77fd7fff3ffdU >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
    pcVar3 = (char16 *)(&DAT_00e106ec + *(int *)(&DAT_00e106ec + (ulong)uVar5 * 4));
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
                       ,0x1eb,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pcVar3 = L"";
  }
  return pcVar3;
}

Assistant:

const char16 * JsrtDebugUtils::GetClassName(Js::TypeId typeId)
{
    switch (typeId)
    {
    case Js::TypeIds_Object:
    case Js::TypeIds_ArrayIterator:
    case Js::TypeIds_MapIterator:
    case Js::TypeIds_SetIterator:
    case Js::TypeIds_StringIterator:
                                            return _u("Object");

    case Js::TypeIds_Proxy:                 return _u("Proxy");
    case Js::TypeIds_Array:
    case Js::TypeIds_NativeIntArray:
#if ENABLE_COPYONACCESS_ARRAY
    case Js::TypeIds_CopyOnAccessNativeIntArray:
#endif
    case Js::TypeIds_NativeFloatArray:
    case Js::TypeIds_ES5Array:
    case Js::TypeIds_CharArray:
    case Js::TypeIds_BoolArray:
                                            return _u("Array");

    case Js::TypeIds_Date:
                                            return _u("Date");

    case Js::TypeIds_RegEx:                 return _u("RegExp");
    case Js::TypeIds_Error:                 return _u("Error");
    case Js::TypeIds_BooleanObject:         return _u("Boolean");
    case Js::TypeIds_NumberObject:          return _u("Number");
    case Js::TypeIds_StringObject:          return _u("String");
    case Js::TypeIds_Arguments:             return _u("Object");
    case Js::TypeIds_ArrayBuffer:           return _u("ArrayBuffer");
    case Js::TypeIds_Int8Array:             return _u("Int8Array");
    case Js::TypeIds_Uint8Array:            return _u("Uint8Array");
    case Js::TypeIds_Uint8ClampedArray:     return _u("Uint8ClampedArray");
    case Js::TypeIds_Int16Array:            return _u("Int16Array");
    case Js::TypeIds_Uint16Array:           return _u("Uint16Array");
    case Js::TypeIds_Int32Array:            return _u("Int32Array");
    case Js::TypeIds_Uint32Array:           return _u("Uint32Array");
    case Js::TypeIds_Float32Array:          return _u("Float32Array");
    case Js::TypeIds_Float64Array:          return _u("Float64Array");
    case Js::TypeIds_Int64Array:            return _u("Int64Array");
    case Js::TypeIds_Uint64Array:           return _u("Uint64Array");
    case Js::TypeIds_DataView:              return _u("DataView");
    case Js::TypeIds_Map:                   return _u("Map");
    case Js::TypeIds_Set:                   return _u("Set");
    case Js::TypeIds_WeakMap:               return _u("WeakMap");
    case Js::TypeIds_WeakSet:               return _u("WeakSet");
    case Js::TypeIds_SymbolObject:          return _u("Symbol");
    case Js::TypeIds_Generator:             return _u("Generator");
    case Js::TypeIds_AsyncGenerator:        return _u("AsyncGenerator");
    case Js::TypeIds_AsyncFromSyncIterator: return _u("AsyncFromSyncIterator");
    case Js::TypeIds_Promise:               return _u("Promise");
    case Js::TypeIds_GlobalObject:          return _u("Object");
    case Js::TypeIds_SpreadArgument:        return _u("Spread");
#ifdef ENABLE_WASM
    case Js::TypeIds_WebAssemblyModule:     return _u("WebAssembly.Module");
    case Js::TypeIds_WebAssemblyInstance:   return _u("WebAssembly.Instance");
    case Js::TypeIds_WebAssemblyMemory:     return _u("WebAssembly.Memory");
    case Js::TypeIds_WebAssemblyTable:      return _u("WebAssembly.Table");
#endif
    default:
        Assert(false);
    }
    return _u("");
}